

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

int ssl_cert_add1_chain_cert(CERT *cert,X509 *x509)

{
  bool bVar1;
  UniquePtr<CRYPTO_BUFFER> buffer;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_28;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_20;
  
  if (cert->x509_method == (SSL_X509_METHOD *)0x0) {
    __assert_fail("cert->x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x27d,"int ssl_cert_add1_chain_cert(CERT *, X509 *)");
  }
  bssl::x509_to_buffer((bssl *)&local_28,x509);
  if (local_28._M_head_impl == (crypto_buffer_st *)0x0) {
    bVar1 = true;
  }
  else {
    local_20._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (crypto_buffer_st *)0x0;
    bVar1 = ssl_credential_st::AppendIntermediateCert
                      ((cert->legacy_credential)._M_t.
                       super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl,
                       (UniquePtr<CRYPTO_BUFFER> *)&local_20);
    bVar1 = !bVar1;
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_20);
  }
  if (!bVar1) {
    OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)cert->x509_chain,sk_X509_call_free_func,X509_free);
    cert->x509_chain = (stack_st_X509 *)0x0;
  }
  std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_28);
  return (uint)!bVar1;
}

Assistant:

static int ssl_cert_add1_chain_cert(CERT *cert, X509 *x509) {
  assert(cert->x509_method);

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x509);
  if (!buffer ||
      !cert->legacy_credential->AppendIntermediateCert(std::move(buffer))) {
    return 0;
  }

  ssl_crypto_x509_cert_flush_cached_chain(cert);
  return 1;
}